

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

int ctemplate_htmlparser::jsparser_buffer_set(jsparser_ctx *js,int pos,char value)

{
  uint uVar1;
  
  if (-1 < pos) {
    __assert_fail("pos < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x11b,"int ctemplate_htmlparser::jsparser_buffer_set(jsparser_ctx *, int, char)")
    ;
  }
  uVar1 = jsparser_buffer_absolute_pos(js,pos);
  if (-1 < (int)uVar1) {
    js->buffer[uVar1] = value;
  }
  return (uint)(-1 < (int)uVar1);
}

Assistant:

int jsparser_buffer_set(jsparser_ctx *js, int pos, char value)
{
  int absolute_pos;
  assert(pos < 0);

  absolute_pos = jsparser_buffer_absolute_pos(js, pos);
  if (absolute_pos < 0) {
    return 0;
  }

  js->buffer[absolute_pos] = value;
  return 1;
}